

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qutil.cc
# Opt level: O0

void os_wrapper_test(void)

{
  int status;
  ostream *poVar1;
  runtime_error *s;
  string local_38;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"before remove");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"remove file",(allocator<char> *)((long)&s + 7));
  status = remove("/this/file/does/not/exist");
  QUtil::os_wrapper(&local_38,status);
  std::__cxx11::string::~string((string *)&local_38);
  std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
  poVar1 = std::operator<<((ostream *)&std::cout,"after remove");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
os_wrapper_test()
{
    try {
        std::cout << "before remove" << std::endl;
        QUtil::os_wrapper("remove file", remove("/this/file/does/not/exist"));
        std::cout << "after remove" << std::endl;
    } catch (std::runtime_error& s) {
        std::cout << "exception: " << s.what() << std::endl;
    }
}